

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O2

void __thiscall UnifiedRegex::RuntimeCharTrie::Print(RuntimeCharTrie *this,DebugWriter *w)

{
  int i;
  long lVar1;
  long lVar2;
  
  DebugWriter::Indent(w);
  lVar2 = 8;
  for (lVar1 = 0; lVar1 < this->count; lVar1 = lVar1 + 1) {
    DebugWriter::PrintQuotedChar(w,*(Char *)((long)this->children + lVar2 + -8));
    DebugWriter::EOL(w);
    Print((RuntimeCharTrie *)((long)&this->children->c + lVar2),w);
    lVar2 = lVar2 + 0x18;
  }
  DebugWriter::Unindent(w);
  return;
}

Assistant:

void RuntimeCharTrie::Print(DebugWriter* w) const
    {
        w->Indent();
        for (int i = 0; i < count; i++)
        {
            w->PrintQuotedChar(children[i].c);
            w->EOL();
            children[i].node.Print(w);
        }
        w->Unindent();
    }